

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O0

void CivetServer::webSocketCloseHandler(mg_connection *conn,void *cbdata)

{
  mg_request_info *pmVar1;
  CivetWebSocketHandler *handler;
  CivetServer *me;
  mg_request_info *request_info;
  void *cbdata_local;
  mg_connection *conn_local;
  
  pmVar1 = mg_get_request_info(conn);
  if ((*(long *)((long)pmVar1->user_data + 8) != 0) && (cbdata != (void *)0x0)) {
    (**(code **)(*cbdata + 0x28))(cbdata,pmVar1->user_data,conn);
  }
  return;
}

Assistant:

void
CivetServer::webSocketCloseHandler(const struct mg_connection *conn,
                                   void *cbdata)
{
	const struct mg_request_info *request_info = mg_get_request_info(conn);
	assert(request_info != NULL);
	CivetServer *me = (CivetServer *)(request_info->user_data);
	assert(me != NULL);

	// Happens when a request hits the server before the context is saved
	if (me->context == NULL)
		return;

	CivetWebSocketHandler *handler = (CivetWebSocketHandler *)cbdata;

	if (handler) {
		handler->handleClose(me, conn);
	}
}